

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColorPicker.cpp
# Opt level: O1

void __thiscall gui::ColorPicker::handleMouseMove(ColorPicker *this)

{
  Vector2f *in_RSI;
  
  handleMouseMove((ColorPicker *)
                  &this[-1].hsvaTextBoxes_._M_elems[3].
                   super___shared_ptr<gui::MultilineTextBox,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ,in_RSI);
  return;
}

Assistant:

bool ColorPicker::handleMouseMove(const sf::Vector2f& mouseParent) {
    if (baseClass::handleMouseMove(mouseParent)) {
        return true;
    }
    const auto mouseLocal = toLocalOriginSpace(mouseParent);

    if (isDragging_) {
        if (sf::Mouse::isButtonPressed(sf::Mouse::Left)) {
            GUI_DEBUG << "ColorPicker::handleMouseMove() with mouse down.\n";
            const auto shadingRectangleSize = getShadingRectangleSize();
            updateShadingRectangle(mouseLocal.x / shadingRectangleSize.x, 1.0f - mouseLocal.y / shadingRectangleSize.y);
        } else {
            isDragging_ = false;
        }
    }

    return isDragging_;
}